

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

void nn_binproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_sinproc *sinproc;
  nn_list_item *it;
  nn_binproc *binproc;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long local_38;
  nn_list_item *local_28;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_ins_unbind((nn_ins_item *)0x13a1a9);
    local_28 = nn_list_begin((nn_list *)(local_38 + 0x80));
    while (pnVar2 = nn_list_end((nn_list *)(local_38 + 0x80)), local_28 != pnVar2) {
      nn_sinproc_stop((nn_sinproc *)0x13a21e);
      local_28 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
    }
    *(undefined4 *)(local_38 + 0x58) = 3;
  }
  else {
    if (*(int *)(local_38 + 0x58) != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
              ,0xb0);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI != 1 || in_EDX != 7) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "src == NN_BINPROC_SRC_SINPROC && type == NN_SINPROC_STOPPED",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
              ,0xa2);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98);
    nn_sinproc_term((nn_sinproc *)0x13a301);
    nn_free((void *)0x13a30b);
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x80));
  if (iVar1 != 0) {
    *(undefined4 *)(local_38 + 0x58) = 1;
    nn_fsm_stopped_noevent((nn_fsm *)0x13a33c);
    nn_ep_stopped((nn_ep *)0x13a34a);
  }
  return;
}

Assistant:

static void nn_binproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_list_item *it;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {

        /*  First, unregister the endpoint from the global repository of inproc
            endpoints. This way, new connections cannot be created anymore. */
        nn_ins_unbind (&binproc->item);

        /*  Stop the existing connections. */
        for (it = nn_list_begin (&binproc->sinprocs);
              it != nn_list_end (&binproc->sinprocs);
              it = nn_list_next (&binproc->sinprocs, it)) {
            sinproc = nn_cont (it, struct nn_sinproc, item);
            nn_sinproc_stop (sinproc);
        }

        binproc->state = NN_BINPROC_STATE_STOPPING;
        goto finish;
    }
    if (binproc->state == NN_BINPROC_STATE_STOPPING) {
        nn_assert (src == NN_BINPROC_SRC_SINPROC && type == NN_SINPROC_STOPPED);
        sinproc = (struct nn_sinproc*) srcptr;
        nn_list_erase (&binproc->sinprocs, &sinproc->item);
        nn_sinproc_term (sinproc);
        nn_free (sinproc);
finish:
        if (!nn_list_empty (&binproc->sinprocs))
            return;
        binproc->state = NN_BINPROC_STATE_IDLE;
        nn_fsm_stopped_noevent (&binproc->fsm);
        nn_ep_stopped (binproc->item.ep);
        return;
    }

    nn_fsm_bad_state(binproc->state, src, type);
}